

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CHog.h
# Opt level: O1

void __thiscall
CHog::initialHist(CHog *this,int _imgWidth,int _imgHeight,int _imgChannel,int _windowWidth,
                 int _windowHeight,int _numOriHalf,int _numOriFull,int _cellSize)

{
  undefined1 auVar1 [16];
  int iVar2;
  histCell **pphVar3;
  ulong uVar4;
  ulong uVar5;
  histCell *phVar6;
  void *pvVar7;
  int **ppiVar8;
  int *piVar9;
  ostream *poVar10;
  size_t sVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  size_t sVar16;
  
  if ((_windowWidth % _cellSize == 0) &&
     (iVar2 = _windowHeight / _cellSize, _windowHeight % _cellSize == 0)) {
    this->cellSize = _cellSize;
    this->windowHeight = _windowHeight;
    this->windowWidth = _windowWidth;
    this->numCellX = _windowWidth / _cellSize;
    this->numCellY = iVar2;
    this->histSizeX = _windowWidth / _cellSize + 2;
    this->histSizeY = iVar2 + 2;
    this->imgWidth = _imgWidth;
    this->imgHeight = _imgHeight;
    this->imgChannel = _imgChannel;
    this->widthStep = _imgChannel * _imgWidth;
    uVar12 = (long)iVar2 * 8 + 0x10;
    if (iVar2 < -2) {
      uVar12 = 0xffffffffffffffff;
    }
    pphVar3 = (histCell **)operator_new__(uVar12);
    this->hist = pphVar3;
    if (0 < this->histSizeY) {
      sVar11 = (long)_numOriFull * 8;
      if (_numOriFull < 0) {
        sVar11 = 0xffffffffffffffff;
      }
      uVar12 = (long)_numOriHalf * 8;
      if (_numOriHalf < 0) {
        uVar12 = 0xffffffffffffffff;
      }
      uVar4 = (long)(_numOriHalf + _numOriFull) * 8 + 0x20;
      if (_numOriHalf + _numOriFull < -4) {
        uVar4 = 0xffffffffffffffff;
      }
      lVar14 = 0;
      do {
        auVar1._8_8_ = 0;
        auVar1._0_8_ = (long)this->histSizeX;
        uVar5 = SUB168(auVar1 * ZEXT816(0x30),0);
        if (SUB168(auVar1 * ZEXT816(0x30),8) != 0) {
          uVar5 = 0xffffffffffffffff;
        }
        phVar6 = (histCell *)operator_new__(uVar5);
        this->hist[lVar14] = phVar6;
        if (0 < this->histSizeX) {
          lVar15 = 0;
          lVar13 = 0;
          do {
            pvVar7 = operator_new__(sVar11);
            pphVar3 = this->hist;
            *(void **)((long)&pphVar3[lVar14]->cellBinsFull + lVar15) = pvVar7;
            pvVar7 = operator_new__(uVar12);
            *(void **)((long)&pphVar3[lVar14]->cellBinsHalf + lVar15) = pvVar7;
            *(int *)((long)&pphVar3[lVar14]->dim + lVar15) = _numOriFull + _numOriHalf + 4;
            pvVar7 = operator_new__(uVar4);
            *(void **)((long)&pphVar3[lVar14]->feat + lVar15) = pvVar7;
            phVar6 = pphVar3[lVar14];
            *(int *)((long)&phVar6->numOriFull + lVar15) = _numOriFull;
            *(int *)((long)&phVar6->numOriHalf + lVar15) = _numOriHalf;
            *(undefined8 *)((long)&phVar6->normFactorHalf + lVar15) = 0;
            memset(*(void **)((long)&phVar6->cellBinsFull + lVar15),0,(long)_numOriFull * 8);
            memset(*(void **)((long)&this->hist[lVar14]->cellBinsHalf + lVar15),0,
                   (long)*(int *)((long)&this->hist[lVar14]->numOriHalf + lVar15) << 3);
            memset(*(void **)((long)&this->hist[lVar14]->feat + lVar15),0,
                   (long)*(int *)((long)&this->hist[lVar14]->dim + lVar15) << 3);
            lVar13 = lVar13 + 1;
            lVar15 = lVar15 + 0x30;
          } while (lVar13 < this->histSizeX);
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 < this->histSizeY);
    }
    uVar12 = (long)this->imgHeight * 8;
    if ((long)this->imgHeight < 0) {
      uVar12 = 0xffffffffffffffff;
    }
    ppiVar8 = (int **)operator_new__(uVar12);
    this->dx = ppiVar8;
    ppiVar8 = (int **)operator_new__(uVar12);
    this->dy = ppiVar8;
    if (0 < this->imgHeight) {
      lVar14 = 0;
      do {
        sVar11 = (long)this->imgWidth * 4;
        sVar16 = sVar11;
        if ((long)this->imgWidth < 0) {
          sVar16 = 0xffffffffffffffff;
        }
        piVar9 = (int *)operator_new__(sVar16);
        this->dx[lVar14] = piVar9;
        piVar9 = (int *)operator_new__(sVar16);
        this->dy[lVar14] = piVar9;
        memset(this->dx[lVar14],0,sVar11);
        memset(this->dy[lVar14],0,(long)this->imgWidth << 2);
        lVar14 = lVar14 + 1;
      } while (lVar14 < this->imgHeight);
    }
    return;
  }
  poVar10 = std::operator<<((ostream *)&std::cout,"image size is not N*cellSize");
  std::endl<char,std::char_traits<char>>(poVar10);
  exit(0);
}

Assistant:

void CHog::initialHist(int _imgWidth,
                       int _imgHeight,
                       int _imgChannel,
                       int _windowWidth,
                       int _windowHeight,
                       int _numOriHalf, //方向量化个数
                       int _numOriFull,
                       int _cellSize) //cell尺寸
{
    //cout<<"hog hist intializing"<<endl;
    if(_windowWidth%_cellSize!=0 || _windowHeight%_cellSize!=0)  //判断图像尺寸是否是cell尺寸的整倍数
    {
        cout<<"image size is not N*cellSize"<<endl;
        exit(0);
    }
    cellSize = _cellSize;
    windowHeight = _windowHeight;
    windowWidth = _windowWidth;
    numCellX = _windowWidth/cellSize;
    numCellY = _windowHeight/cellSize;
    histSizeX = numCellX + 2;
    histSizeY = numCellY + 2;
    imgWidth = _imgWidth;
    imgHeight = _imgHeight;
    imgChannel = _imgChannel;
    widthStep = imgWidth*imgChannel;
    //为直方图分配空间，并赋初始值0//
    hist = new histCell*[histSizeY];
    for(int y=0; y<histSizeY; y++)
    {
        hist[y] = new histCell[histSizeX];
        for(int x=0; x<histSizeX; x++)
        {
            hist[y][x].cellBinsFull = new double[_numOriFull];  //为一个cell进行空间分配
            hist[y][x].cellBinsHalf = new double[_numOriHalf];
            hist[y][x].dim = 4 + (_numOriFull+_numOriHalf);
            hist[y][x].feat = new double[hist[y][x].dim];
            hist[y][x].numOriFull = _numOriFull;
            hist[y][x].numOriHalf = _numOriHalf;
            //hist[y][x].normFactorFull = 0.;
            hist[y][x].normFactorHalf = 0.;
            memset(hist[y][x].cellBinsFull, 0, hist[y][x].numOriFull*sizeof(double));  //将直方图初始化为全0
            memset(hist[y][x].cellBinsHalf, 0, hist[y][x].numOriHalf*sizeof(double));
            memset(hist[y][x].feat, 0, hist[y][x].dim*sizeof(double));
        }
    }
    //为微分图像分配空间,并赋初始值0//
    dx = new int*[imgHeight];
    dy = new int*[imgHeight];
    for(int y=0; y<imgHeight; y++)
    {
        dx[y] = new int[imgWidth];
        dy[y] = new int[imgWidth];
        memset(dx[y], 0, imgWidth*sizeof(int));
        memset(dy[y], 0, imgWidth*sizeof(int));
    }
    //cout<<"hog hist intialized"<<endl;
}